

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall absl::SimpleAtob(absl *this,string_view str,bool *value)

{
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view piece1_04;
  string_view piece1_05;
  string_view piece1_06;
  string_view piece1_07;
  string_view piece1_08;
  bool bVar1;
  bool local_172;
  bool local_171;
  string_view local_170;
  bool *local_160;
  char *local_158;
  string_view local_150;
  bool *local_140;
  char *local_138;
  string_view local_130;
  bool *local_120;
  char *local_118;
  string_view local_110;
  bool *local_100;
  char *local_f8;
  string_view local_f0;
  bool *local_e0;
  char *local_d8;
  string_view local_d0;
  bool *local_c0;
  char *local_b8;
  string_view local_b0;
  bool *local_a0;
  char *local_98;
  string_view local_90;
  bool *local_80;
  char *local_78;
  string_view local_70;
  bool *local_60;
  char *local_58;
  string_view local_50;
  bool *local_40;
  char *local_38;
  char *local_30;
  char *absl_raw_logging_internal_basename;
  bool *value_local;
  string_view str_local;
  
  absl_raw_logging_internal_basename = (char *)str.length_;
  str_local.ptr_ = str.ptr_;
  value_local = (bool *)this;
  if (absl_raw_logging_internal_basename == (char *)0x0) {
    local_30 = "numbers.cc";
    raw_logging_internal::RawLog
              (kFatal,"numbers.cc",0x88,"Check %s failed: %s","value != nullptr",
               "Output pointer must not be nullptr.");
  }
  local_40 = value_local;
  local_38 = str_local.ptr_;
  string_view::string_view(&local_50,"true");
  piece1_08.length_ = (size_type)local_38;
  piece1_08.ptr_ = local_40;
  bVar1 = anon_unknown_0::CaseEqual(piece1_08,local_50);
  local_171 = true;
  if (!bVar1) {
    local_60 = value_local;
    local_58 = str_local.ptr_;
    string_view::string_view(&local_70,"t");
    piece1_07.length_ = (size_type)local_58;
    piece1_07.ptr_ = local_60;
    bVar1 = anon_unknown_0::CaseEqual(piece1_07,local_70);
    local_171 = true;
    if (!bVar1) {
      local_80 = value_local;
      local_78 = str_local.ptr_;
      string_view::string_view(&local_90,"yes");
      piece1_06.length_ = (size_type)local_78;
      piece1_06.ptr_ = local_80;
      bVar1 = anon_unknown_0::CaseEqual(piece1_06,local_90);
      local_171 = true;
      if (!bVar1) {
        local_a0 = value_local;
        local_98 = str_local.ptr_;
        string_view::string_view(&local_b0,"y");
        piece1_05.length_ = (size_type)local_98;
        piece1_05.ptr_ = local_a0;
        bVar1 = anon_unknown_0::CaseEqual(piece1_05,local_b0);
        local_171 = true;
        if (!bVar1) {
          local_c0 = value_local;
          local_b8 = str_local.ptr_;
          string_view::string_view(&local_d0,"1");
          piece1_04.length_ = (size_type)local_b8;
          piece1_04.ptr_ = local_c0;
          local_171 = anon_unknown_0::CaseEqual(piece1_04,local_d0);
        }
      }
    }
  }
  if (local_171 == false) {
    local_e0 = value_local;
    local_d8 = str_local.ptr_;
    string_view::string_view(&local_f0,"false");
    piece1_03.length_ = (size_type)local_d8;
    piece1_03.ptr_ = local_e0;
    bVar1 = anon_unknown_0::CaseEqual(piece1_03,local_f0);
    local_172 = true;
    if (!bVar1) {
      local_100 = value_local;
      local_f8 = str_local.ptr_;
      string_view::string_view(&local_110,"f");
      piece1_02.length_ = (size_type)local_f8;
      piece1_02.ptr_ = local_100;
      bVar1 = anon_unknown_0::CaseEqual(piece1_02,local_110);
      local_172 = true;
      if (!bVar1) {
        local_120 = value_local;
        local_118 = str_local.ptr_;
        string_view::string_view(&local_130,"no");
        piece1_01.length_ = (size_type)local_118;
        piece1_01.ptr_ = local_120;
        bVar1 = anon_unknown_0::CaseEqual(piece1_01,local_130);
        local_172 = true;
        if (!bVar1) {
          local_140 = value_local;
          local_138 = str_local.ptr_;
          string_view::string_view(&local_150,"n");
          piece1_00.length_ = (size_type)local_138;
          piece1_00.ptr_ = local_140;
          bVar1 = anon_unknown_0::CaseEqual(piece1_00,local_150);
          local_172 = true;
          if (!bVar1) {
            local_160 = value_local;
            local_158 = str_local.ptr_;
            string_view::string_view(&local_170,"0");
            piece1.length_ = (size_type)local_158;
            piece1.ptr_ = local_160;
            local_172 = anon_unknown_0::CaseEqual(piece1,local_170);
          }
        }
      }
    }
    if (local_172 == false) {
      str_local.length_._7_1_ = false;
    }
    else {
      *absl_raw_logging_internal_basename = '\0';
      str_local.length_._7_1_ = true;
    }
  }
  else {
    *absl_raw_logging_internal_basename = '\x01';
    str_local.length_._7_1_ = true;
  }
  return str_local.length_._7_1_;
}

Assistant:

bool SimpleAtob(absl::string_view str, bool* value) {
  ABSL_RAW_CHECK(value != nullptr, "Output pointer must not be nullptr.");
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}